

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigShow.c
# Opt level: O1

void Aig_ManShow(Aig_Man_t *pMan,int fHaig,Vec_Ptr_t *vBold)

{
  char *__src;
  FILE *__stream;
  int fHaig_00;
  char FileNameDot [200];
  char acStack_e8 [208];
  
  __src = Extra_FileNameGenericAppend(pMan->pName,".dot");
  strcpy(acStack_e8,__src);
  __stream = fopen(acStack_e8,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",acStack_e8);
  }
  else {
    fclose(__stream);
    Aig_WriteDotAig(pMan,acStack_e8,fHaig_00,vBold);
    Abc_ShowFile(acStack_e8);
  }
  return;
}

Assistant:

void Aig_ManShow( Aig_Man_t * pMan, int fHaig, Vec_Ptr_t * vBold )
{
    extern void Abc_ShowFile( char * FileNameDot );
    char FileNameDot[200];
    FILE * pFile;
    // create the file name
    sprintf( FileNameDot, "%s", Extra_FileNameGenericAppend(pMan->pName, ".dot") );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    fclose( pFile );
    // generate the file
    Aig_WriteDotAig( pMan, FileNameDot, fHaig, vBold );
    // visualize the file 
    Abc_ShowFile( FileNameDot );
}